

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall Tree::BuildVirtualFolderImpl(Tree *this,string *virtualFolders,string *prefix)

{
  Tree *pTVar1;
  Tree *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50,"CMake Files\\",prefix);
  std::operator+(&local_90,&local_50,&this->path);
  std::operator+(&local_70,&local_90,"\\;");
  std::__cxx11::string::append((string *)virtualFolders);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar1 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pTVar1; this_00 = this_00 + 1) {
    std::operator+(&local_90,prefix,&this->path);
    std::operator+(&local_70,&local_90,"\\");
    BuildVirtualFolderImpl(this_00,virtualFolders,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

void Tree::BuildVirtualFolderImpl(std::string& virtualFolders,
                                  const std::string& prefix) const
{
  virtualFolders += "CMake Files\\" + prefix + this->path + "\\;";
  for (Tree const& folder : this->folders) {
    folder.BuildVirtualFolderImpl(virtualFolders, prefix + this->path + "\\");
  }
}